

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_mrecv_(void *buf,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *message,
                  MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  mpi_mrecv_();
  return;
}

Assistant:

void mpiabi_mrecv_(
  void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  MPIABI_Fint * message,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_mrecv_(
    buf,
    count,
    datatype,
    message,
    status,
    ierror
  );
}